

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_exception_inst_addr_mis(DisasContext_conflict12 *ctx)

{
  TCGContext_conflict11 *tcg_ctx;
  TCGv_i32 arg2;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_movi_i64_riscv64(tcg_ctx,tcg_ctx->cpu_pc,(ctx->base).pc_next);
  tcg_gen_st_i64_riscv64(tcg_ctx,tcg_ctx->cpu_pc,tcg_ctx->cpu_env,0x220);
  arg2 = tcg_const_i32_riscv64(tcg_ctx,0);
  gen_helper_raise_exception_riscv64(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_exception_inst_addr_mis(DisasContext *ctx)
{
    generate_exception_mbadaddr(ctx, RISCV_EXCP_INST_ADDR_MIS);
}